

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

int gauden_smooth_var(vector_t ***var,float32 **var_floor,uint32 n_mgau,uint32 n_stream,
                     uint32 n_density,uint32 *veclen)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  float32 *pfVar4;
  vector_t *ppfVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (n_stream != 0) {
    uVar7 = 0;
    do {
      uVar3 = veclen[uVar7];
      if ((ulong)uVar3 != 0) {
        pfVar4 = var_floor[uVar7];
        uVar9 = 0;
        do {
          if (n_mgau != 0) {
            fVar2 = (float)pfVar4[uVar9];
            uVar8 = 0;
            do {
              if (n_density != 0) {
                ppfVar5 = var[uVar8][uVar7];
                uVar6 = 0;
                do {
                  pfVar1 = ppfVar5[uVar6] + uVar9;
                  if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
                    ppfVar5[uVar6][uVar9] = fVar2;
                  }
                  uVar6 = uVar6 + 1;
                } while (n_density != uVar6);
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 != n_mgau);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar3);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != n_stream);
  }
  return 0;
}

Assistant:

int
gauden_smooth_var(vector_t ***var,
		  float32 **var_floor,
		  uint32 n_mgau,
		  uint32 n_stream,
		  uint32 n_density,
		  const uint32 *veclen)
{
    uint32 i, j, k, l;
    float32 flr;
    
    for (j = 0; j < n_stream; j++) {
	for (l = 0; l < veclen[j]; l++) {

	    flr = var_floor[j][l];

	    for (i = 0; i < n_mgau; i++) {
		for (k = 0; k < n_density; k++) {
		    if (var[i][j][k][l] < flr) var[i][j][k][l] = flr;
		}
	    }
	}
    }

    return S3_SUCCESS;
}